

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cc
# Opt level: O2

void __thiscall Object::internalProjection(Object *this,Vector2d *obs)

{
  pointer pEVar1;
  ulong uVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  HeapType heap;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  EdgeCompFunctor local_38;
  
  local_38.egs = &this->edges;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
  ::priority_queue(&heap,&local_38,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_58);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_58);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  while( true ) {
    pEVar1 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((pointer)(((long)(this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pEVar1) / 0x60) <=
        local_58._M_impl.super__Vector_impl_data._M_start) break;
    if (pEVar1[(long)local_58._M_impl.super__Vector_impl_data._M_start].valid == true) {
      std::
      priority_queue<unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>,EdgeCompFunctor>
      ::emplace<unsigned_long&>
                ((priority_queue<unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>,EdgeCompFunctor>
                  *)&heap,(unsigned_long *)&local_58);
    }
    local_58._M_impl.super__Vector_impl_data._M_start =
         (pointer)((long)local_58._M_impl.super__Vector_impl_data._M_start + 1);
  }
  while (heap.c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start !=
         heap.c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish) {
    uVar2 = *heap.c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::
    priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
    ::pop(&heap);
    lVar3 = 0;
    uVar4 = 0;
    while( true ) {
      pEVar1 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pEVar1) / 0x60) <= uVar4) break;
      if ((uVar2 != uVar4) && ((&pEVar1->valid)[lVar3] != false)) {
        printf("Source : %lu, dst: %lu\n",uVar2,uVar4);
        projectEdge2Edge(this,pEVar1 + uVar2,obs,
                         (Edge *)((long)&(pEVar1->
                                         super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                         ).
                                         super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                         ._M_impl + lVar3),&heap);
        printf("After Source : %lu, dst: %lu\n",uVar2,uVar4);
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x60;
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&heap);
  return;
}

Assistant:

void Object::internalProjection(const Eigen::Vector2d& obs) {
    HeapType heap(edges);
    for (size_t i = 0; i < edges.size(); i++) {
        if (edges[i].valid)
            heap.emplace(i);
    }
    while (heap.empty() == false) {
        size_t top = heap.top();
        heap.pop();
        for (size_t i = 0; i < edges.size(); i++) {
            Edge& this_edge = edges[top];
            Edge& eg = edges[i];
            if (eg.valid == false || &eg == &this_edge)
                continue;
            printf("Source : %lu, dst: %lu\n", top, i);
            projectEdge2Edge(this_edge, obs, eg, heap);
            printf("After Source : %lu, dst: %lu\n", top, i);
        }
    }
}